

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptString.cpp
# Opt level: O3

BOOL Js::JavascriptString::GetThisValueVar
               (Var aValue,JavascriptString **pString,ScriptContext *scriptContext)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  JavascriptStringObject *this;
  JavascriptString *pJVar4;
  
  if (pString == (JavascriptString **)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptString.cpp"
                                ,0xc78,"(pString)","pString");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
  }
  bVar2 = VarIs<Js::JavascriptString>(aValue);
  if (!bVar2) {
    bVar2 = VarIs<Js::JavascriptStringObject>(aValue);
    if (!bVar2) {
      return 0;
    }
    this = VarTo<Js::JavascriptStringObject>(aValue);
    pJVar4 = JavascriptStringObject::InternalUnwrap(this);
    *pString = pJVar4;
    aValue = CrossSite::MarshalVar
                       (scriptContext,pJVar4,
                        (((((this->super_DynamicObject).super_RecyclableObject.type.ptr)->
                          javascriptLibrary).ptr)->super_JavascriptLibraryBase).scriptContext.ptr);
  }
  pJVar4 = VarTo<Js::JavascriptString>(aValue);
  *pString = pJVar4;
  return 1;
}

Assistant:

BOOL JavascriptString::GetThisValueVar(Var aValue, JavascriptString** pString, ScriptContext* scriptContext)
    {
        Assert(pString);

        // 1. If Type(value) is String, return value.
        if (VarIs<JavascriptString>(aValue))
        {
            *pString = VarTo<JavascriptString>(aValue);
            return TRUE;
        }
        // 2. If Type(value) is Object and value has a [[StringData]] internal slot
        else if ( VarIs<JavascriptStringObject>(aValue))
        {
            JavascriptStringObject* pStringObj = VarTo<JavascriptStringObject>(aValue);

            // a. Let s be the value of value's [[StringData]] internal slot.
            // b. If s is not undefined, then return s.
            *pString = pStringObj->Unwrap();
            *pString = VarTo<JavascriptString>(CrossSite::MarshalVar(scriptContext,
              *pString, pStringObj->GetScriptContext()));
            return TRUE;
        }

        // 3. Throw a TypeError exception.
        // Note: We don't throw a TypeError here, choosing to return FALSE and let the caller throw the error
        return FALSE;
    }